

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling_test.cpp
# Opt level: O2

void __thiscall VarianceEstimator_Merge_Test::TestBody(VarianceEstimator_Merge_Test *this)

{
  undefined1 auVar1 [16];
  int iVar2;
  char *pcVar3;
  VarianceEstimator<double> *v;
  pointer ve_00;
  undefined1 auVar4 [16];
  Float FVar5;
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  AssertHelper AStack_a8;
  Stratified1DIter __begin1;
  Stratified1DIter __end1;
  double local_68;
  Float err;
  VarianceEstimator<double> veFinal;
  vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_> ve;
  RNG rng;
  
  std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>::
  vector(&ve,0x10,(allocator_type *)&veFinal);
  veFinal.mean = (double)CONCAT44(veFinal.mean._4_4_,10000);
  veFinal.S = 0.0;
  rng.state = 0x853c49e6748fea9b;
  rng.inc = 0xda3e39cb94b95bdb;
  veFinal.n = -0x7ac3b6198b701565;
  pbrt::detail::IndexingGenerator<pbrt::Stratified1D,_pbrt::detail::Stratified1DIter>::begin
            (&__begin1,
             (IndexingGenerator<pbrt::Stratified1D,_pbrt::detail::Stratified1DIter> *)&veFinal);
  pbrt::detail::IndexingGenerator<pbrt::Stratified1D,_pbrt::detail::Stratified1DIter>::end
            (&__end1,(IndexingGenerator<pbrt::Stratified1D,_pbrt::detail::Stratified1DIter> *)
                     &veFinal);
  local_68 = 0.0;
  for (; __begin1.super_RNGIterator<pbrt::detail::Stratified1DIter>.
         super_IndexingIterator<pbrt::detail::Stratified1DIter>.i !=
         __end1.super_RNGIterator<pbrt::detail::Stratified1DIter>.
         super_IndexingIterator<pbrt::detail::Stratified1DIter>.i;
      __begin1.super_RNGIterator<pbrt::detail::Stratified1DIter>.
      super_IndexingIterator<pbrt::detail::Stratified1DIter>.i =
           __begin1.super_RNGIterator<pbrt::detail::Stratified1DIter>.
           super_IndexingIterator<pbrt::detail::Stratified1DIter>.i + 1) {
    FVar5 = pbrt::detail::Stratified1DIter::operator*(&__begin1);
    iVar2 = pbrt::RNG::Uniform<int>
                      (&rng,(int)(((long)ve.
                                         super__Vector_base<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)ve.
                                        super__Vector_base<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start) / 0x18),
                       (enable_if_t<std::is_integral<int>::value> *)0x0);
    dVar6 = (double)(FVar5 - (1.0 - FVar5));
    pbrt::VarianceEstimator<double>::Add
              (ve.
               super__Vector_base<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>
               ._M_impl.super__Vector_impl_data._M_start + iVar2,dVar6);
    local_68 = local_68 + dVar6;
  }
  veFinal.n = 0;
  veFinal.mean = 0.0;
  veFinal.S = 0.0;
  for (ve_00 = ve.
               super__Vector_base<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      ve_00 != ve.
               super__Vector_base<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>
               ._M_impl.super__Vector_impl_data._M_finish; ve_00 = ve_00 + 1) {
    pbrt::VarianceEstimator<double>::Merge(&veFinal,ve_00);
  }
  __end1.super_RNGIterator<pbrt::detail::Stratified1DIter>.
  super_IndexingIterator<pbrt::detail::Stratified1DIter>.i = -0x2d0e5604;
  __end1.super_RNGIterator<pbrt::detail::Stratified1DIter>.
  super_IndexingIterator<pbrt::detail::Stratified1DIter>.n = 0x3f50624d;
  dVar6 = veFinal.S / (double)(veFinal.n + -1) + -0.3333333333333333;
  auVar7._0_4_ = (float)dVar6;
  auVar7._4_4_ = (int)((ulong)dVar6 >> 0x20);
  auVar7._8_8_ = 0;
  auVar4._8_4_ = 0x7fffffff;
  auVar4._0_8_ = 0x7fffffff7fffffff;
  auVar4._12_4_ = 0x7fffffff;
  auVar4 = vandps_avx512vl(auVar7,auVar4);
  err = (Float)((uint)(1 < veFinal.n) * auVar4._0_4_ + (uint)(1 >= veFinal.n) * 0x3eaaaaab);
  testing::internal::CmpHelperLT<float,double>
            ((internal *)&__begin1,"err","1e-3",&err,(double *)&__end1);
  if ((char)__begin1.super_RNGIterator<pbrt::detail::Stratified1DIter>.
            super_IndexingIterator<pbrt::detail::Stratified1DIter>.i == '\0') {
    testing::Message::Message((Message *)&__end1);
    std::ostream::_M_insert<double>
              ((double)((ulong)(1 < veFinal.n) * (long)(veFinal.S / (double)(veFinal.n + -1))));
    if (__begin1.super_RNGIterator<pbrt::detail::Stratified1DIter>.rng.state == 0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)__begin1.super_RNGIterator<pbrt::detail::Stratified1DIter>.rng.state;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/sampling_test.cpp"
               ,0x3be,pcVar3);
    testing::internal::AssertHelper::operator=(&AStack_a8,(Message *)&__end1);
    testing::internal::AssertHelper::~AssertHelper(&AStack_a8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&__end1);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&__begin1.super_RNGIterator<pbrt::detail::Stratified1DIter>.rng);
  __end1.super_RNGIterator<pbrt::detail::Stratified1DIter>.
  super_IndexingIterator<pbrt::detail::Stratified1DIter>.i = -0x771c970f;
  __end1.super_RNGIterator<pbrt::detail::Stratified1DIter>.
  super_IndexingIterator<pbrt::detail::Stratified1DIter>.n = 0x3ee4f8b5;
  dVar6 = (local_68 / 10000.0 - veFinal.mean) / (local_68 / 10000.0);
  auVar8._0_4_ = (float)dVar6;
  auVar8._4_4_ = (int)((ulong)dVar6 >> 0x20);
  auVar8._8_8_ = 0;
  auVar1._8_4_ = 0x7fffffff;
  auVar1._0_8_ = 0x7fffffff7fffffff;
  auVar1._12_4_ = 0x7fffffff;
  auVar4 = vandps_avx512vl(auVar8,auVar1);
  err = auVar4._0_4_;
  testing::internal::CmpHelperLT<float,double>
            ((internal *)&__begin1,"err","1e-5",&err,(double *)&__end1);
  if ((char)__begin1.super_RNGIterator<pbrt::detail::Stratified1DIter>.
            super_IndexingIterator<pbrt::detail::Stratified1DIter>.i == '\0') {
    testing::Message::Message((Message *)&__end1);
    if (__begin1.super_RNGIterator<pbrt::detail::Stratified1DIter>.rng.state == 0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)__begin1.super_RNGIterator<pbrt::detail::Stratified1DIter>.rng.state;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/sampling_test.cpp"
               ,0x3c1,pcVar3);
    testing::internal::AssertHelper::operator=(&AStack_a8,(Message *)&__end1);
    testing::internal::AssertHelper::~AssertHelper(&AStack_a8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&__end1);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&__begin1.super_RNGIterator<pbrt::detail::Stratified1DIter>.rng);
  std::
  _Vector_base<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>::
  ~_Vector_base(&ve.
                 super__Vector_base<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>
               );
  return;
}

Assistant:

TEST(VarianceEstimator, Merge) {
    int n = 16;
    std::vector<VarianceEstimator<double>> ve(n);

    RNG rng;
    int count = 10000;
    double sum = 0;
    for (Float u : Stratified1D(count)) {
        Float v = Lerp(u, -1, 1);
        int index = rng.Uniform<int>(ve.size());
        ve[index].Add(v);
        sum += v;
    }

    VarianceEstimator<double> veFinal;
    for (const auto &v : ve)
        veFinal.Merge(v);

    // f(x) = 0, random variables x_i uniform in [-1,1] ->
    // variance is E[x^2] on [-1,1] == 1/3
    Float err = std::abs(veFinal.Variance() - 1. / 3.);
    EXPECT_LT(err, 1e-3) << veFinal.Variance();

    err = std::abs((sum / count - veFinal.Mean()) / (sum / count));
    EXPECT_LT(err, 1e-5);
}